

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O0

void set_status(rtr_mgr_config *conf,rtr_mgr_group *group,rtr_mgr_status mgr_status,
               rtr_socket *rtr_sock)

{
  byte bVar1;
  long lVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  rtr_socket *rtr_sock_local;
  rtr_mgr_status mgr_status_local;
  rtr_mgr_group *group_local;
  rtr_mgr_config *conf_local;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = group->preference;
  pcVar3 = rtr_mgr_status_to_str(mgr_status);
  lrtr_dbg("RTR_MGR: Group(%u) status changed to: %s",(ulong)bVar1,pcVar3);
  group->status = mgr_status;
  if (conf->status_fp != (rtr_mgr_status_fp)0x0) {
    (*conf->status_fp)(group,mgr_status,rtr_sock,conf->status_fp_data);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void set_status(const struct rtr_mgr_config *conf, struct rtr_mgr_group *group, enum rtr_mgr_status mgr_status,
		       const struct rtr_socket *rtr_sock)
{
	MGR_DBG("Group(%u) status changed to: %s", group->preference, rtr_mgr_status_to_str(mgr_status));

	group->status = mgr_status;
	if (conf->status_fp)
		conf->status_fp(group, mgr_status, rtr_sock, conf->status_fp_data);
}